

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intercept.cpp
# Opt level: O1

void __thiscall
CLIntercept::usmAllocPropertiesOverride
          (CLIntercept *this,cl_mem_properties_intel *properties,
          cl_mem_properties_intel **pLocalAllocProperties)

{
  bool bVar1;
  long lVar2;
  ulong uVar3;
  cl_mem_properties_intel *pcVar4;
  ulong uVar5;
  cl_mem_properties_intel cVar6;
  long lVar7;
  byte bVar8;
  
  bVar1 = (this->m_Config).RelaxAllocationLimits;
  uVar3 = 0;
  bVar8 = bVar1;
  if (properties == (cl_mem_properties_intel *)0x0) {
LAB_001832ac:
    uVar5 = uVar3 + 2;
    if ((bVar8 & 1) == 0) {
      uVar5 = uVar3;
    }
    lVar7 = 0;
    pcVar4 = (cl_mem_properties_intel *)
             operator_new__(-(ulong)(uVar5 >> 0x3d != 0) | uVar5 << 3 | 8);
    *pLocalAllocProperties = pcVar4;
    if (properties != (cl_mem_properties_intel *)0x0) {
      lVar7 = 0;
      cVar6 = *properties;
      while (cVar6 != 0) {
        pcVar4[lVar7] = cVar6;
        uVar3 = properties[lVar7 + 1];
        uVar5 = uVar3 | 0x800000;
        if ((bVar1 & 1U) == 0) {
          uVar5 = uVar3;
        }
        if (cVar6 != 0x1101) {
          uVar5 = uVar3;
        }
        pcVar4[lVar7 + 1] = uVar5;
        lVar2 = lVar7 + 2;
        lVar7 = lVar7 + 2;
        cVar6 = properties[lVar2];
      }
    }
    if ((bVar8 & 1) != 0) {
      pcVar4[lVar7] = 0x1101;
      pcVar4[lVar7 + 1] = (ulong)bVar1 << 0x17;
      lVar7 = lVar7 + 2;
    }
    pcVar4[lVar7] = 0;
    return;
  }
  do {
    if (properties[uVar3] == 0x1101) {
      bVar8 = 0;
    }
    else if (properties[uVar3] == 0) goto LAB_001832ac;
    uVar3 = uVar3 + 2;
  } while( true );
}

Assistant:

void CLIntercept::usmAllocPropertiesOverride(
    const cl_mem_properties_intel* properties,
    cl_mem_properties_intel*& pLocalAllocProperties ) const
{
    const cl_mem_flags CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL = (1 << 23);

    bool    addMemFlagsEnum = config().RelaxAllocationLimits != 0;

    size_t  numProperties = 0;
    if( properties )
    {
        while( properties[ numProperties ] != 0 )
        {
            switch( properties[ numProperties ] )
            {
            case CL_MEM_FLAGS:
                addMemFlagsEnum = false;
                break;
            default:
                break;
            }
            numProperties += 2;
        }
    }

    if( addMemFlagsEnum )
    {
        numProperties += 2;
    }

    // Allocate a new array of properties.  We need to allocate two
    // properties for each pair, plus one property for the terminating
    // zero.
    pLocalAllocProperties = new cl_queue_properties[ numProperties + 1 ];
    if( pLocalAllocProperties )
    {
        // Copy the old properties array to the new properties array,
        // if the new properties array exists.
        numProperties = 0;
        if( properties )
        {
            while( properties[ numProperties ] != 0 )
            {
                pLocalAllocProperties[ numProperties ] = properties[ numProperties ];
                if( properties[ numProperties ] == CL_MEM_FLAGS )
                {
                    CLI_ASSERT( addMemFlagsEnum == false );

                    cl_mem_properties_intel flags = properties[ numProperties + 1 ];
                    if( config().RelaxAllocationLimits )
                    {
                        flags |= CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL;
                    }

                    pLocalAllocProperties[ numProperties + 1 ] = flags;
                }
                else
                {
                    pLocalAllocProperties[ numProperties + 1 ] =
                        properties[ numProperties + 1 ];
                }
                numProperties += 2;
            }
        }
        if( addMemFlagsEnum )
        {
            pLocalAllocProperties[ numProperties] = CL_MEM_FLAGS;

            cl_mem_properties_intel flags = 0;
            if( config().RelaxAllocationLimits )
            {
                flags |= CL_MEM_ALLOW_UNRESTRICTED_SIZE_INTEL;
            }

            pLocalAllocProperties[ numProperties + 1 ] = flags;
            numProperties += 2;
        }

        // Add the terminating zero.
        pLocalAllocProperties[ numProperties ] = 0;
    }
}